

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O3

void __thiscall OpenMD::ZConstraintForceModifier::modifyForces(ZConstraintForceModifier *this)

{
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *fixedZmols;
  double dVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  RealType RVar4;
  Vector3d VStack_38;
  
  this->currSnapshot_ = ((this->super_ForceModifier).info_)->sman_->currentSnapshot_;
  if (this->usingZconsGap_ == true) {
    p_Var3 = (this->fixedZMols_).
             super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var3 != (_List_node_base *)&this->fixedZMols_) {
      dVar1 = this->zconsGap_;
      do {
        p_Var3[1]._M_prev = (_List_node_base *)((double)p_Var3[1]._M_prev + dVar1);
        p_Var3 = p_Var3->_M_next;
      } while (p_Var3 != (_List_node_base *)&this->fixedZMols_);
    }
  }
  bVar2 = checkZConsState(this);
  if (bVar2) {
    calcTotalMassMovingZMols(this);
    zeroVelocity(this);
  }
  fixedZmols = &this->fixedZMols_;
  if ((this->fixedZMols_).
      super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)fixedZmols) {
    doZconstraintForce(this);
  }
  if ((this->movingZMols_).
      super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)&this->movingZMols_) {
    doHarmonic(this);
  }
  RVar4 = Snapshot::getTime(this->currSnapshot_);
  if (this->currZconsTime_ <= RVar4) {
    for (p_Var3 = (fixedZmols->
                  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>)
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var3 != (_List_node_base *)fixedZmols; p_Var3 = p_Var3->_M_next) {
      Molecule::getCom(&VStack_38,(Molecule *)p_Var3[1]._M_next);
      p_Var3[3]._M_prev = (_List_node_base *)VStack_38.super_Vector<double,_3U>.data_[2];
    }
    ZConsWriter::writeFZ(this->fzOut,fixedZmols);
    this->currZconsTime_ = this->zconsTime_ + this->currZconsTime_;
  }
  return;
}

Assistant:

void ZConstraintForceModifier::modifyForces() {
    currSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

    if (usingZconsGap_) { updateZPos(); }

    if (checkZConsState()) {
      calcTotalMassMovingZMols();
      zeroVelocity();
    }

    // do zconstraint force;
    if (haveFixedZMols()) { doZconstraintForce(); }

    // use external force to move the molecules to the specified positions
    if (haveMovingZMols()) { doHarmonic(); }

    // write out forces and current positions of z-constraint molecules
    if (currSnapshot_->getTime() >= currZconsTime_) {
      std::list<ZconstraintMol>::iterator i;
      Vector3d com;
      for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
        com     = i->mol->getCom();
        i->zpos = com[whichDirection];
      }

      fzOut->writeFZ(fixedZMols_);
      currZconsTime_ += zconsTime_;
    }
  }